

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O0

void TasGrid::constructSurrogate<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,double tolerance,
               TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
               string *checkpoint_filename)

{
  double grid_00;
  TasmanianSparseGrid *max_samples_per_job_00;
  size_t num_parallel_jobs_00;
  size_t max_num_points_00;
  bool bVar1;
  runtime_error *this;
  anon_class_32_4_7142f7b3 local_b0;
  function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)> local_90;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  local_70;
  TypeRefinement local_3c;
  double dStack_38;
  TypeRefinement criteria_local;
  double tolerance_local;
  TasmanianSparseGrid *grid_local;
  size_t max_samples_per_job_local;
  size_t num_parallel_jobs_local;
  size_t max_num_points_local;
  ModelSignature *model_local;
  
  local_3c = criteria;
  dStack_38 = tolerance;
  tolerance_local = (double)grid;
  grid_local = (TasmanianSparseGrid *)max_samples_per_job;
  max_samples_per_job_local = num_parallel_jobs;
  num_parallel_jobs_local = max_num_points;
  max_num_points_local = (size_t)model;
  bVar1 = TasmanianSparseGrid::isLocalPolynomial(grid);
  if (!bVar1) {
    bVar1 = TasmanianSparseGrid::isWavelet((TasmanianSparseGrid *)tolerance_local);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  ::function(&local_70,model);
  max_num_points_00 = num_parallel_jobs_local;
  num_parallel_jobs_00 = max_samples_per_job_local;
  max_samples_per_job_00 = grid_local;
  grid_00 = tolerance_local;
  local_b0.tolerance = &stack0xffffffffffffffc8;
  local_b0.criteria = &local_3c;
  local_b0.output = &output;
  local_b0.level_limits = level_limits;
  std::function<std::vector<double,std::allocator<double>>(TasGrid::TasmanianSparseGrid&)>::
  function<TasGrid::constructSurrogate<false,false>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&,unsigned_long)>,unsigned_long,unsigned_long,unsigned_long,TasGrid::TasmanianSparseGrid&,double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,std::__cxx11::string_const&)::_lambda(TasGrid::TasmanianSparseGrid&)_1_,void>
            ((function<std::vector<double,std::allocator<double>>(TasGrid::TasmanianSparseGrid&)> *)
             &local_90,&local_b0);
  constructCommon<false,false>
            (&local_70,max_num_points_00,num_parallel_jobs_00,(size_t)max_samples_per_job_00,
             (TasmanianSparseGrid *)grid_00,&local_90,checkpoint_filename);
  std::function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>::
  ~function(&local_90);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  ::~function(&local_70);
  return;
}

Assistant:

void constructSurrogate(ModelSignature model,
                        size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                        TasmanianSparseGrid &grid,
                        double tolerance, TypeRefinement criteria, int output = -1,
                        std::vector<int> const &level_limits = std::vector<int>(),
                        std::string const &checkpoint_filename = std::string()){
    if (!grid.isLocalPolynomial() && !grid.isWavelet()) throw std::runtime_error("ERROR: construction (with tolerance and criteria) called for a grid that is not local polynomial or wavelet.");
    constructCommon<parallel_construction, initial_guess>
                                          (model, max_num_points, num_parallel_jobs, max_samples_per_job, grid,
                                           [&](TasmanianSparseGrid &g)->std::vector<double>{
                                               return g.getCandidateConstructionPoints(tolerance, criteria, output, level_limits);
                                           }, checkpoint_filename);
}